

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmath.c
# Opt level: O0

void print_unicode(uint64_t num,_Bool uppercase_hex,encoding_t to_unicode)

{
  ulong local_a0;
  size_t i;
  size_t offset [3];
  size_t to_unicode_size;
  size_t utf8_size;
  char *to_unicode_bytes;
  char to_unicode_buf [8];
  char *utf8;
  char utf8_buf [8];
  size_t in_bytes_size;
  size_t in_size;
  char *to_unicode_input;
  char *utf8_input;
  char number_as_byte_array [8];
  size_t conversion;
  iconv_t cd;
  encoding_t to_unicode_local;
  _Bool uppercase_hex_local;
  uint64_t num_local;
  
  memset(&utf8_input,0,8);
  to_unicode_input = (char *)&utf8_input;
  in_size = (size_t)&utf8_input;
  in_bytes_size = 8;
  utf8_buf[0] = '\b';
  utf8_buf[1] = '\0';
  utf8_buf[2] = '\0';
  utf8_buf[3] = '\0';
  utf8_buf[4] = '\0';
  utf8_buf[5] = '\0';
  utf8_buf[6] = '\0';
  utf8_buf[7] = '\0';
  memset(&utf8,0,8);
  to_unicode_buf = (char  [8])&utf8;
  memset(&to_unicode_bytes,0,8);
  utf8_size = (size_t)&to_unicode_bytes;
  to_unicode_size = 8;
  offset[2] = 8;
  offset[0] = 2;
  offset[1] = 4;
  utf8_input = (char *)num;
  printf("%s: ",to_encoding_pretty_print_lookup[to_unicode]);
  if (num < 0x1f) {
    fputs("<special> ",stdout);
  }
  else {
    number_as_byte_array =
         (char  [8])
         iconv(iconv_descriptors[0],&to_unicode_input,&in_bytes_size,(char **)to_unicode_buf,
               &to_unicode_size);
    if (number_as_byte_array == (char  [8])0xffffffffffffffff) {
      fputs("<invalid> ",stdout);
    }
    else {
      printf("%s ",&utf8);
    }
  }
  number_as_byte_array =
       (char  [8])
       iconv(iconv_descriptors[to_unicode],(char **)&in_size,(size_t *)utf8_buf,(char **)&utf8_size,
             offset + 2);
  if (number_as_byte_array == (char  [8])0xffffffffffffffff) {
    puts("<invalid>");
  }
  else {
    fputs("(0x",stdout);
    for (local_a0 = 0; local_a0 < 8 - (offset[2] + offset[(ulong)to_unicode - 1]);
        local_a0 = local_a0 + 1) {
      if (uppercase_hex) {
        printf("%0*lX",2,(ulong)(byte)to_unicode_buf[local_a0 - 8]);
      }
      else {
        printf("%0*lx",2,(ulong)(byte)to_unicode_buf[local_a0 - 8]);
      }
    }
    puts(")");
  }
  return;
}

Assistant:

static void print_unicode(uint64_t num, bool uppercase_hex,
			  enum encoding_t to_unicode)
{
	iconv_t cd;
	size_t conversion;

	char number_as_byte_array[8] = { 0 };
	char *utf8_input = number_as_byte_array;
	char *to_unicode_input = number_as_byte_array;
	size_t in_size = sizeof number_as_byte_array;
	size_t in_bytes_size = sizeof number_as_byte_array;

	char utf8_buf[8] = { 0 };
	char *utf8 = utf8_buf;
	char to_unicode_buf[8] = { 0 };
	char *to_unicode_bytes = to_unicode_buf;
	size_t utf8_size = sizeof utf8_buf;
	size_t to_unicode_size = sizeof to_unicode_buf;

	size_t offset[3] = { 1, 2, 4 };

	memcpy(&number_as_byte_array, &num, sizeof num);

	printf("%s: ", to_encoding_pretty_print_lookup[to_unicode]);

	// Convert to UTF-8
	if (num < 31) {
		fputs("<special> ", stdout);
	} else {
		cd = iconv_descriptors[UTF8];
		conversion =
			iconv(cd, &utf8_input, &in_size, &utf8, &utf8_size);

		if (conversion == (size_t)-1) {
			fputs("<invalid> ", stdout);
		} else {
			printf("%s ", utf8_buf);
		}
	}

	// Convert from_unicode to to_unicode
	cd = iconv_descriptors[to_unicode];
	conversion = iconv(cd, &to_unicode_input, &in_bytes_size,
			   &to_unicode_bytes, &to_unicode_size);

	if (conversion == (size_t)-1) {
		puts("<invalid>");
		return;
	}

	fputs("(0x", stdout);

	/*
	 re: offset
	 This kind of works because iconv decrements the output buffer size, and we
	 know based on UTF8-16 if there's 1-2 null bytes at the end of our buffer,
	 and with UTF32, the null character is 4 bytes.
	 */
	for (size_t i = 0; i < 8 - (to_unicode_size + offset[to_unicode]);
	     i++) {
		__print_hex((uint64_t)0xff & to_unicode_buf[i], 2,
			    uppercase_hex);
	}

	puts(")");
}